

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python.cc
# Opt level: O0

Import * __thiscall flatbuffers::python::Imports::Import(Imports *this,string *module)

{
  reference pvVar1;
  undefined1 local_58 [8];
  Import import;
  string *module_local;
  Imports *this_local;
  
  import.name.field_2._8_8_ = module;
  python::Import::Import((Import *)local_58);
  std::__cxx11::string::operator=((string *)local_58,(string *)import.name.field_2._8_8_);
  std::vector<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>::push_back
            (&this->imports,(value_type *)local_58);
  pvVar1 = std::vector<flatbuffers::python::Import,_std::allocator<flatbuffers::python::Import>_>::
           back(&this->imports);
  python::Import::~Import((Import *)local_58);
  return pvVar1;
}

Assistant:

const python::Import &python::Imports::Import(const std::string &module) {
  python::Import import;
  import.module = module;
  imports.push_back(std::move(import));
  return imports.back();
}